

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_consumer.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnDataConsumer::ConsumeChunks
          (ColumnDataConsumer *this,idx_t delete_index_start,idx_t delete_index_end)

{
  element_type *peVar1;
  element_type *peVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  reference this_00;
  reference this_01;
  ulong uVar5;
  reference pvVar6;
  BlockHandle *pBVar7;
  size_type sVar8;
  
  if (delete_index_start < delete_index_end) {
    do {
      if (delete_index_start != 0) {
        this_00 = vector<duckdb::ColumnDataConsumer::ChunkReference,_true>::operator[]
                            (&this->chunk_references,delete_index_start - 1);
        this_01 = vector<duckdb::ColumnDataConsumer::ChunkReference,_true>::operator[]
                            (&this->chunk_references,delete_index_start);
        peVar1 = (this_00->segment->allocator).internal.
                 super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar2 = (this_01->segment->allocator).internal.
                 super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar3 = ChunkReference::GetMinimumBlockID(this_00);
        uVar4 = ChunkReference::GetMinimumBlockID(this_01);
        if (peVar1 == peVar2) {
          if (uVar3 < uVar4) {
            sVar8 = (size_type)uVar3;
            do {
              pvVar6 = vector<duckdb::BlockMetaData,_true>::operator[](&peVar1->blocks,sVar8);
              pBVar7 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&pvVar6->handle);
              LOCK();
              (pBVar7->destroy_buffer_upon)._M_i = UNPIN;
              UNLOCK();
              sVar8 = sVar8 + 1;
            } while (uVar4 != sVar8);
          }
        }
        else {
          sVar8 = (size_type)uVar3;
          uVar5 = ((long)*(pointer *)
                          ((long)&(peVar1->blocks).
                                  super_vector<duckdb::BlockMetaData,_std::allocator<duckdb::BlockMetaData>_>
                          + 8) -
                   *(long *)&(peVar1->blocks).
                             super_vector<duckdb::BlockMetaData,_std::allocator<duckdb::BlockMetaData>_>
                             .
                             super__Vector_base<duckdb::BlockMetaData,_std::allocator<duckdb::BlockMetaData>_>
                  >> 3) * -0x5555555555555555;
          if (sVar8 <= uVar5 && uVar5 - sVar8 != 0) {
            do {
              uVar3 = uVar3 + 1;
              pvVar6 = vector<duckdb::BlockMetaData,_true>::operator[](&peVar1->blocks,sVar8);
              pBVar7 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&pvVar6->handle);
              LOCK();
              (pBVar7->destroy_buffer_upon)._M_i = UNPIN;
              UNLOCK();
              sVar8 = (size_type)uVar3;
              uVar5 = ((long)*(pointer *)
                              ((long)&(peVar1->blocks).
                                      super_vector<duckdb::BlockMetaData,_std::allocator<duckdb::BlockMetaData>_>
                              + 8) -
                       *(long *)&(peVar1->blocks).
                                 super_vector<duckdb::BlockMetaData,_std::allocator<duckdb::BlockMetaData>_>
                                 .
                                 super__Vector_base<duckdb::BlockMetaData,_std::allocator<duckdb::BlockMetaData>_>
                      >> 3) * -0x5555555555555555;
            } while (sVar8 <= uVar5 && uVar5 - sVar8 != 0);
          }
        }
      }
      delete_index_start = delete_index_start + 1;
    } while (delete_index_start != delete_index_end);
  }
  return;
}

Assistant:

void ColumnDataConsumer::ConsumeChunks(idx_t delete_index_start, idx_t delete_index_end) {
	for (idx_t chunk_index = delete_index_start; chunk_index < delete_index_end; chunk_index++) {
		if (chunk_index == 0) {
			continue;
		}
		auto &prev_chunk_ref = chunk_references[chunk_index - 1];
		auto &curr_chunk_ref = chunk_references[chunk_index];
		auto prev_allocator = prev_chunk_ref.segment->allocator.get();
		auto curr_allocator = curr_chunk_ref.segment->allocator.get();
		auto prev_min_block_id = prev_chunk_ref.GetMinimumBlockID();
		auto curr_min_block_id = curr_chunk_ref.GetMinimumBlockID();
		if (prev_allocator != curr_allocator) {
			// Moved to the next allocator, delete all remaining blocks in the previous one
			for (uint32_t block_id = prev_min_block_id; block_id < prev_allocator->BlockCount(); block_id++) {
				prev_allocator->SetDestroyBufferUponUnpin(block_id);
			}
			continue;
		}
		// Same allocator, see if we can delete blocks
		for (uint32_t block_id = prev_min_block_id; block_id < curr_min_block_id; block_id++) {
			prev_allocator->SetDestroyBufferUponUnpin(block_id);
		}
	}
}